

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O0

bool __thiscall cmBinUtilsWindowsPELinker::Prepare(cmBinUtilsWindowsPELinker *this)

{
  cmRuntimeDependencyArchive *this_00;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string local_230;
  undefined1 local_210 [8];
  ostringstream e;
  unique_ptr<cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool>_>
  local_98;
  unique_ptr<cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool>_>
  local_90 [3];
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string tool;
  cmBinUtilsWindowsPELinker *this_local;
  
  cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
            ((string *)
             &command.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (this->super_cmBinUtilsLinker).Archive);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50);
    this_00 = (this->super_cmBinUtilsLinker).Archive;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"dumpbin",&local_71);
    bVar1 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                      (this_00,&local_70,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)
                 &command.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"dumpbin");
    }
    else {
      std::__cxx11::string::operator=
                ((string *)
                 &command.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"objdump");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &command.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"dumpbin");
  if (bVar1) {
    std::
    make_unique<cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool,cmRuntimeDependencyArchive*&>
              ((cmRuntimeDependencyArchive **)local_90);
    std::
    unique_ptr<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>>
    ::operator=((unique_ptr<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>>
                 *)&this->Tool,local_90);
    std::
    unique_ptr<cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool>_>
    ::~unique_ptr(local_90);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &command.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"objdump");
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_210);
      poVar3 = std::operator<<((ostream *)local_210,
                               "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: ");
      std::operator<<(poVar3,(string *)
                             &command.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::ostringstream::str();
      cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_210);
      goto LAB_005a8941;
    }
    std::
    make_unique<cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool,cmRuntimeDependencyArchive*&>
              ((cmRuntimeDependencyArchive **)&local_98);
    std::
    unique_ptr<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>>
    ::operator=((unique_ptr<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>>
                 *)&this->Tool,&local_98);
    std::
    unique_ptr<cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool>_>
    ::~unique_ptr(&local_98);
  }
  this_local._7_1_ = true;
LAB_005a8941:
  std::__cxx11::string::~string
            ((string *)
             &command.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._7_1_;
}

Assistant:

bool cmBinUtilsWindowsPELinker::Prepare()
{
  std::string tool = this->Archive->GetGetRuntimeDependenciesTool();
  if (tool.empty()) {
    std::vector<std::string> command;
    if (this->Archive->GetGetRuntimeDependenciesCommand("dumpbin", command)) {
      tool = "dumpbin";
    } else {
      tool = "objdump";
    }
  }
  if (tool == "dumpbin") {
    this->Tool =
      cm::make_unique<cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool>(
        this->Archive);
  } else if (tool == "objdump") {
    this->Tool =
      cm::make_unique<cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool>(
        this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: " << tool;
    this->SetError(e.str());
    return false;
  }

  return true;
}